

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::checkContent
          (BooleanDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  XMLCh XVar1;
  XMLCh XVar2;
  DatatypeValidator *pDVar3;
  bool bVar4;
  InvalidDatatypeValueException *this_00;
  ulong uVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  
  pDVar3 = (this->super_DatatypeValidator).fBaseValidator;
  if (pDVar3 != (DatatypeValidator *)0x0) {
    (*(pDVar3->super_XSerializable)._vptr_XSerializable[0xc])(pDVar3,content,context,1,manager);
  }
  if ((((this->super_DatatypeValidator).fFacetsDefined & 8) != 0) &&
     (bVar4 = RegularExpression::matches((this->super_DatatypeValidator).fRegex,content,manager),
     !bVar4)) {
    this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
               ,0x69,VALUE_NotMatch_Pattern,content,(this->super_DatatypeValidator).fPattern,
               (XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002f1f7d:
    __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
  }
  if (!asBase) {
    uVar5 = 0;
    do {
      pXVar6 = &XMLUni::fgBooleanValueSpace + uVar5 * 8;
      if (pXVar6 == content) break;
      pXVar7 = content;
      if (content == (XMLCh *)0x0) {
LAB_002f1ee6:
        if (*pXVar6 == L'\0') break;
      }
      else {
        do {
          XVar1 = *pXVar7;
          if (XVar1 == L'\0') goto LAB_002f1ee6;
          XVar2 = *pXVar6;
          pXVar6 = pXVar6 + 1;
          pXVar7 = pXVar7 + 1;
        } while (XVar1 == XVar2);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < 4);
    if (uVar5 == 4) {
      this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x7e,VALUE_Invalid_Name,content,L"boolean",(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002f1f7d;
    }
  }
  return;
}

Assistant:

void BooleanDatatypeValidator::checkContent( const XMLCh*             const content
                                           ,       ValidationContext* const context
                                           ,       bool                     asBase
                                           ,       MemoryManager*     const manager)
{

    //validate against base validator if any
    BooleanDatatypeValidator *pBaseValidator = (BooleanDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator !=0)
        pBaseValidator->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    unsigned int   i = 0;
    for ( ; i < XMLUni::fgBooleanValueSpaceArraySize; i++ )
    {
        if ( XMLString::equals(content, XMLUni::fgBooleanValueSpace[i]))
            break;
    }

    if (i == XMLUni::fgBooleanValueSpaceArraySize)
        ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                           , XMLExcepts::VALUE_Invalid_Name
                           , content
                           , SchemaSymbols::fgDT_BOOLEAN
                           , manager);
        //Not valid boolean type

}